

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_get(fdb_kvs_handle *handle,fdb_doc *doc)

{
  void *pvVar1;
  size_t __n;
  long lVar2;
  hbtrie *phVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  docio_length len;
  ushort uVar6;
  undefined2 uVar7;
  ulong uVar8;
  fdb_doc *handle_00;
  bool bVar9;
  int64_t iVar10;
  size_t sVar11;
  undefined1 *puVar12;
  void *__dest;
  undefined8 uStackY_120;
  undefined1 auStackY_118 [6];
  undefined2 uVar13;
  docio_object *in_stack_fffffffffffffef0;
  fdb_kvs_id_t local_108;
  undefined8 uStack_100;
  bool alloced_body;
  bool alloced_meta;
  ulong uStack_f8;
  int size_chunk;
  fdb_doc doc_kv;
  fdb_txn *txn;
  hbtrie_result hr;
  fdb_status wr;
  _fdb_key_cmp_info cmp_info;
  docio_handle *dhandle;
  filemgr *wal_file;
  docio_object _doc;
  int64_t _offset;
  uint64_t offset;
  fdb_doc *doc_local;
  fdb_kvs_handle *handle_local;
  
  uVar13 = (undefined2)((uint)stack0xfffffffffffffeec >> 0x10);
  puVar12 = auStackY_118;
  uStackY_120 = 0x13f32c;
  offset = (uint64_t)doc;
  doc_local = (fdb_doc *)handle;
  docio_object::docio_object(in_stack_fffffffffffffef0);
  uVar7 = uVar13;
  txn._0_4_ = HBTRIE_RESULT_FAIL;
  if (doc_local == (fdb_doc *)0x0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
  }
  else if (((((offset == 0) || (*(long *)(offset + 0x20) == 0)) || (*(long *)offset == 0)) ||
           (0xff80 < *(ulong *)offset)) ||
          ((doc_local->metalen != 0 &&
           ((ulong)(*(int *)((long)&doc_local[1].key + 4) - 0x100) < *(ulong *)offset)))) {
    handle_local._4_4_ = FDB_RESULT_INVALID_ARGS;
  }
  else {
    uStackY_120 = 0x13f3c3;
    uVar6 = (ushort)uVar13 >> 8;
    bVar9 = atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffef0,(uint8_t)uVar6,
                               (uint8_t)uVar7);
    if (bVar9) {
      uStackY_120 = 0x13f3e8;
      memcpy(&stack0xffffffffffffff08,(void *)offset,0x50);
      if (doc_local->size_ondisk != 0) {
        uStack_100._4_4_ = (uint)*(ushort *)&doc_local[1].key;
        uStack_f8 = *(long *)offset + (long)(int)(uint)*(ushort *)&doc_local[1].key;
        lVar2 = -(uStack_f8 + 0xf & 0xfffffffffffffff0);
        puVar12 = auStackY_118 + lVar2;
        doc_kv.size_ondisk = (size_t)puVar12;
        *(undefined8 *)(auStackY_118 + lVar2 + -8) = 0x13f45b;
        kvid2buf(*(size_t *)((long)&uStack_100 + lVar2),*(fdb_kvs_id_t *)((long)&local_108 + lVar2),
                 *(void **)(&stack0xfffffffffffffef0 + lVar2));
        __dest = (void *)(doc_kv.size_ondisk + (long)(int)uStack_100._4_4_);
        pvVar1 = *(void **)(offset + 0x20);
        __n = *(size_t *)offset;
        *(undefined8 *)(auStackY_118 + lVar2 + -8) = 0x13f480;
        memcpy(__dest,pvVar1,__n);
      }
      handle_00 = doc_local;
      if (doc_local[5].size_ondisk == 0) {
        *(undefined8 *)(puVar12 + -8) = 0x13f49b;
        fdb_check_file_reopen((fdb_kvs_handle *)handle_00,(file_status_t *)0x0);
        lVar2 = *(long *)(*(long *)doc_local->seqnum + 0x1c8);
        doc_kv.deleted = (bool)(char)lVar2;
        doc_kv._73_3_ = (int3)((ulong)lVar2 >> 8);
        doc_kv.flags = (int)((ulong)lVar2 >> 0x20);
        if (lVar2 == 0) {
          doc_kv._72_8_ = *(long *)&doc_local->deleted + 0x130;
        }
      }
      else {
        doc_kv._72_8_ = *(undefined8 *)(doc_local[5].size_ondisk + 0x48);
      }
      if ((doc_local[4].size_ondisk & 0x1000000) == 0) {
        if (doc_local->size_ondisk == 0) {
          *(undefined8 *)(puVar12 + -8) = 0x13f5b3;
          txn._4_4_ = wal_find(*(fdb_txn **)(puVar12 + 0x30),*(filemgr **)(puVar12 + 0x28),
                               *(_fdb_key_cmp_info **)(puVar12 + 0x20),
                               *(snap_handle **)(puVar12 + 0x18),*(fdb_doc **)(puVar12 + 0x10),
                               *(uint64_t **)(puVar12 + 8));
        }
        else {
          *(undefined8 *)(puVar12 + -8) = 0x13f581;
          txn._4_4_ = wal_find(*(fdb_txn **)(puVar12 + 0x30),*(filemgr **)(puVar12 + 0x28),
                               *(_fdb_key_cmp_info **)(puVar12 + 0x20),
                               *(snap_handle **)(puVar12 + 0x18),*(fdb_doc **)(puVar12 + 0x10),
                               *(uint64_t **)(puVar12 + 8));
        }
      }
      else {
        txn._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
      }
      if (doc_local[5].size_ondisk == 0) {
        *(undefined8 *)(puVar12 + -8) = 0x13f5d2;
        fdb_sync_db_header(*(fdb_kvs_handle **)(puVar12 + 0xb0));
      }
      *(undefined8 *)(puVar12 + -8) = 0x13f5e5;
      atomic_incr_uint64_t(*(atomic<unsigned_long> **)(puVar12 + 8),*(memory_order *)(puVar12 + 4));
      if (txn._4_4_ == FDB_RESULT_KEY_NOT_FOUND) {
        *(undefined8 *)(puVar12 + -8) = 0x13f5fb;
        _fdb_sync_dirty_root(*(fdb_kvs_handle **)(puVar12 + 0x18));
        sVar11 = doc_kv.size_ondisk;
        uVar8 = uStack_f8;
        if (doc_local->size_ondisk == 0) {
          phVar3 = (hbtrie *)doc_local->offset;
          pvVar1 = *(void **)(offset + 0x20);
          uVar4 = *(undefined8 *)offset;
          *(undefined8 *)(puVar12 + -8) = 0x13f651;
          txn._0_4_ = hbtrie_find(phVar3,pvVar1,(int)uVar4,&_offset);
        }
        else {
          phVar3 = (hbtrie *)doc_local->offset;
          *(undefined8 *)(puVar12 + -8) = 0x13f627;
          txn._0_4_ = hbtrie_find(phVar3,(void *)sVar11,(int)uVar8,&_offset);
        }
        *(undefined8 *)(puVar12 + -8) = 0x13f664;
        btreeblk_end(*(btreeblk_handle **)(puVar12 + 0x10));
        _offset = (ulong)_offset >> 0x38 | (_offset & 0xff000000000000U) >> 0x28 |
                  (_offset & 0xff0000000000U) >> 0x18 | (_offset & 0xff00000000U) >> 8 |
                  (_offset & 0xff000000U) << 8 | (_offset & 0xff0000U) << 0x18 |
                  (_offset & 0xff00U) << 0x28 | _offset << 0x38;
        *(undefined8 *)(puVar12 + -8) = 0x13f70d;
        _fdb_release_dirty_root(*(fdb_kvs_handle **)(puVar12 + 8));
      }
      if (((txn._4_4_ == FDB_RESULT_SUCCESS) && (_offset != -1)) ||
         ((hbtrie_result)txn == HBTRIE_RESULT_SUCCESS)) {
        uStack_100._3_1_ = *(long *)(offset + 0x38) == 0;
        uStack_100._2_1_ = -(*(long *)(offset + 0x40) == 0) & 1;
        if (doc_local->size_ondisk == 0) {
          wal_file._0_2_ = (ushort)*(undefined8 *)offset;
        }
        else {
          wal_file._0_2_ = (ushort)uStack_f8;
          *(byte *)(offset + 0x48) = (byte)doc_kv.body & 1;
        }
        uVar4 = *(undefined8 *)(offset + 0x38);
        uVar5 = *(undefined8 *)(offset + 0x40);
        if ((txn._4_4_ == FDB_RESULT_SUCCESS) && ((*(byte *)(offset + 0x48) & 1) != 0)) {
          *(undefined8 *)(puVar12 + -8) = 0x13f7e0;
          atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar12 + 8),puVar12[7],puVar12[6]);
          handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
        }
        else {
          *(undefined8 *)(puVar12 + -8) = 0x13f802;
          iVar10 = docio_read_doc(*(docio_handle **)(puVar12 + 0x120),*(uint64_t *)(puVar12 + 0x118)
                                  ,*(docio_object **)(puVar12 + 0x110),(bool)puVar12[0x10f]);
          if (iVar10 < 1) {
            *(undefined8 *)(puVar12 + -8) = 0x13f824;
            atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar12 + 8),puVar12[7],puVar12[6]);
            if (iVar10 < 0) {
              register0x00000000 = (fdb_status)iVar10;
            }
            else {
              stack0xfffffffffffffeec = FDB_RESULT_KEY_NOT_FOUND;
            }
            handle_local._4_4_ = stack0xfffffffffffffeec;
          }
          else if (((ushort)wal_file == uStack_f8) && ((_doc.length.bodylen & 4) == 0)) {
            *(void **)(offset + 0x28) = _doc.key;
            *(ulong *)(offset + 8) = (ulong)wal_file._2_2_;
            *(ulong *)(offset + 0x10) = (ulong)wal_file._4_4_;
            *(undefined8 *)(offset + 0x38) = uVar4;
            *(undefined8 *)(offset + 0x40) = uVar5;
            *(bool *)(offset + 0x48) = (_doc.length.bodylen & 4) != 0;
            len.metalen = wal_file._2_2_;
            len.keylen = (ushort)wal_file;
            len.bodylen = wal_file._4_4_;
            len._12_4_ = _doc.length.bodylen;
            len.bodylen_ondisk = _doc.length._0_4_;
            *(undefined8 *)(puVar12 + -8) = 0x13f92f;
            sVar11 = _fdb_get_docsize(len);
            *(size_t *)(offset + 0x18) = sVar11;
            *(int64_t *)(offset + 0x30) = _offset;
            *(undefined8 *)(puVar12 + -8) = 0x13f95d;
            atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar12 + 8),puVar12[7],puVar12[6]);
            handle_local._4_4_ = FDB_RESULT_SUCCESS;
          }
          else {
            *(undefined8 *)(puVar12 + -8) = 0x13f88d;
            free_docio_object(*(docio_object **)(puVar12 + 8),puVar12[7],puVar12[6],puVar12[5]);
            *(undefined8 *)(puVar12 + -8) = 0x13f8a4;
            atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar12 + 8),puVar12[7],puVar12[6]);
            handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
          }
        }
      }
      else {
        *(undefined8 *)(puVar12 + -8) = 0x13f97d;
        atomic_cas_uint8_t(*(atomic<unsigned_char> **)(puVar12 + 8),puVar12[7],puVar12[6]);
        handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
      }
    }
    else {
      handle_local._4_4_ = FDB_RESULT_HANDLE_BUSY;
    }
  }
  return handle_local._4_4_;
}

Assistant:

LIBFDB_API
fdb_status fdb_get(fdb_kvs_handle *handle, fdb_doc *doc)
{
    uint64_t offset;
    int64_t _offset;
    struct docio_object _doc;
    struct filemgr *wal_file = NULL;
    struct docio_handle *dhandle;
    struct _fdb_key_cmp_info cmp_info;
    fdb_status wr;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_txn *txn;
    fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc || !doc->key || doc->keylen == 0 ||
        doc->keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            doc->keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    doc_kv = *doc;

    if (handle->kvs) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_kv.keylen = doc->keylen + size_chunk;
        doc_kv.key = alca(uint8_t, doc_kv.keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_kv.key);
        memcpy((uint8_t*)doc_kv.key + size_chunk, doc->key, doc->keylen);
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;
    wal_file = handle->file;
    dhandle = handle->dhandle;

    if (handle->config.do_not_search_wal) {
        wr = FDB_RESULT_KEY_NOT_FOUND;
    } else {
        if (handle->kvs) {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, &doc_kv,
                          &offset);
        } else {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, doc,
                          &offset);
        }
    }

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    if (wr == FDB_RESULT_KEY_NOT_FOUND) {
        _fdb_sync_dirty_root(handle);

        if (handle->kvs) {
            hr = hbtrie_find(handle->trie, doc_kv.key, doc_kv.keylen,
                             (void *)&offset);
        } else {
            hr = hbtrie_find(handle->trie, doc->key, doc->keylen,
                             (void *)&offset);
        }
        btreeblk_end(handle->bhandle);
        offset = _endian_decode(offset);

        _fdb_release_dirty_root(handle);
    }

    if ((wr == FDB_RESULT_SUCCESS && offset != BLK_NOT_FOUND) ||
         hr == HBTRIE_RESULT_SUCCESS) {
        bool alloced_meta = doc->meta ? false : true;
        bool alloced_body = doc->body ? false : true;
        if (handle->kvs) {
            _doc.key = doc_kv.key;
            _doc.length.keylen = doc_kv.keylen;
            doc->deleted = doc_kv.deleted; // update deleted field if wal_find
        } else {
            _doc.key = doc->key;
            _doc.length.keylen = doc->keylen;
        }
        _doc.meta = doc->meta;
        _doc.body = doc->body;

        if (wr == FDB_RESULT_SUCCESS && doc->deleted) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        _offset = docio_read_doc(dhandle, offset, &_doc, true);
        if (_offset <= 0) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.keylen != doc_kv.keylen ||
            _doc.length.flag & DOCIO_DELETED) {
            free_docio_object(&_doc, 0, alloced_meta, alloced_body);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        doc->seqnum = _doc.seqnum;
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}